

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Window * sqlite3WindowDup(sqlite3 *db,Expr *pOwner,Window *p)

{
  Window *pWVar1;
  char *pcVar2;
  Expr *pEVar3;
  ExprList *pEVar4;
  
  if ((p != (Window *)0x0) &&
     (pWVar1 = (Window *)sqlite3DbMallocZero(db,0x70), pWVar1 != (Window *)0x0)) {
    pcVar2 = sqlite3DbStrDup(db,p->zName);
    pWVar1->zName = pcVar2;
    pEVar3 = sqlite3ExprDup(db,p->pFilter,0);
    pWVar1->pFilter = pEVar3;
    pEVar4 = sqlite3ExprListDup(db,p->pPartition,0);
    pWVar1->pPartition = pEVar4;
    pEVar4 = sqlite3ExprListDup(db,p->pOrderBy,0);
    pWVar1->pOrderBy = pEVar4;
    pWVar1->eType = p->eType;
    pWVar1->eEnd = p->eEnd;
    pWVar1->eStart = p->eStart;
    pEVar3 = sqlite3ExprDup(db,p->pStart,0);
    pWVar1->pStart = pEVar3;
    pEVar3 = sqlite3ExprDup(db,p->pEnd,0);
    pWVar1->pEnd = pEVar3;
    pWVar1->pOwner = pOwner;
    return pWVar1;
  }
  return (Window *)0x0;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowDup(sqlite3 *db, Expr *pOwner, Window *p){
  Window *pNew = 0;
  if( p ){
    pNew = sqlite3DbMallocZero(db, sizeof(Window));
    if( pNew ){
      pNew->zName = sqlite3DbStrDup(db, p->zName);
      pNew->pFilter = sqlite3ExprDup(db, p->pFilter, 0);
      pNew->pPartition = sqlite3ExprListDup(db, p->pPartition, 0);
      pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, 0);
      pNew->eType = p->eType;
      pNew->eEnd = p->eEnd;
      pNew->eStart = p->eStart;
      pNew->pStart = sqlite3ExprDup(db, p->pStart, 0);
      pNew->pEnd = sqlite3ExprDup(db, p->pEnd, 0);
      pNew->pOwner = pOwner;
    }
  }
  return pNew;
}